

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O0

void __thiscall
CVmImageLoader::load_mres_link(CVmImageLoader *this,ulong siz,CVmImageLoaderMres *res_ifc)

{
  long *in_RDX;
  long in_RSI;
  undefined8 *in_RDI;
  char fname_buf [256];
  char resname_buf [256];
  uint fname_len;
  uint resname_len;
  char buf_1 [1];
  uint i;
  uint entry_cnt;
  char buf [16];
  ulong *in_stack_fffffffffffffda8;
  char *in_stack_fffffffffffffdb8;
  CVmImageLoader *in_stack_fffffffffffffdc0;
  undefined1 local_148 [268];
  uint local_3c;
  uint local_38;
  byte local_31;
  uint local_30;
  uint local_2c;
  undefined1 local_28 [16];
  long *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  read_data(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(size_t)in_RDI,
            in_stack_fffffffffffffda8);
  local_2c = ::osrp2(local_28);
  for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
    read_data(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(size_t)in_RDI,
              in_stack_fffffffffffffda8);
    local_38 = (uint)local_31;
    read_data(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(size_t)in_RDI,
              in_stack_fffffffffffffda8);
    local_148[local_38] = 0;
    read_data(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(size_t)in_RDI,
              in_stack_fffffffffffffda8);
    local_3c = (uint)local_31;
    read_data(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,(size_t)in_RDI,
              in_stack_fffffffffffffda8);
    (&stack0xfffffffffffffdb8)[local_3c] = 0;
    (**(code **)(*local_18 + 0x18))(local_18,&stack0xfffffffffffffdb8,local_3c,local_148,local_38);
  }
  if (local_10 != 0) {
    (**(code **)(*(long *)*in_RDI + 0x48))((long *)*in_RDI,local_10);
  }
  return;
}

Assistant:

void CVmImageLoader::load_mres_link(ulong siz, CVmImageLoaderMres *res_ifc)
{
    char buf[16];
    uint entry_cnt;
    uint i;

    /* read the entry count and size of the table of contents */
    read_data(buf, 2, &siz);
    entry_cnt = osrp2(buf);

    /* read the entries */
    for (i = 0 ; i < entry_cnt ; ++i)
    {
        char buf[1];
        uint resname_len, fname_len;
        char resname_buf[256], fname_buf[256];

        /* read the resource name */
        read_data(buf, 1, &siz);
        resname_len = (uchar)buf[0];
        read_data(resname_buf, resname_len, &siz);
        resname_buf[resname_len] = '\0';

        /* read the local filename this resource is linked to */
        read_data(buf, 1, &siz);
        fname_len = (uchar)buf[0];
        read_data(fname_buf, fname_len, &siz);
        fname_buf[fname_len] = '\0';

        /* add the resource to the resource interface */
        res_ifc->add_resource(fname_buf, fname_len, resname_buf, resname_len);
    }

    /* 
     *   skip the data portion of the block, since we now have a map of
     *   the data and can load individual resources on demand 
     */
    if (siz != 0)
        fp_->skip_ahead(siz);
}